

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseCommand(JSONParser *this,CommandPtr *out_command)

{
  bool bVar1;
  Result RVar2;
  pointer pMVar3;
  pointer pAVar4;
  pointer pRVar5;
  pointer pAVar6;
  pointer pAVar7;
  pointer pAVar8;
  pointer pAVar9;
  pointer pAVar10;
  pointer pAVar11;
  pointer pAVar12;
  pointer pAVar13;
  unique_ptr<spectest::AssertExceptionCommand,_std::default_delete<spectest::AssertExceptionCommand>_>
  local_1a8;
  __single_object command_10;
  unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
  local_180;
  __single_object command_9;
  unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
  local_158;
  __single_object command_8;
  unique_ptr<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>
  local_130;
  __single_object command_7;
  unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
  local_108;
  __single_object command_6;
  unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
  local_e0;
  __single_object command_5;
  unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
  local_b8;
  __single_object command_4;
  unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
  local_90;
  __single_object command_3;
  unique_ptr<spectest::RegisterCommand,_std::default_delete<spectest::RegisterCommand>_> local_70;
  __single_object command_2;
  unique_ptr<spectest::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
  local_50;
  __single_object command_1;
  unique_ptr<spectest::ModuleCommand,_std::default_delete<spectest::ModuleCommand>_> local_30;
  __single_object command;
  CommandPtr *out_command_local;
  JSONParser *this_local;
  
  command._M_t.
  super___uniq_ptr_impl<spectest::ModuleCommand,_std::default_delete<spectest::ModuleCommand>_>._M_t
  .super__Tuple_impl<0UL,_spectest::ModuleCommand_*,_std::default_delete<spectest::ModuleCommand>_>.
  super__Head_base<0UL,_spectest::ModuleCommand_*,_false>._M_head_impl._4_4_ = Expect(this,"{");
  bVar1 = wabt::Failed(command._M_t.
                       super___uniq_ptr_impl<spectest::ModuleCommand,_std::default_delete<spectest::ModuleCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spectest::ModuleCommand_*,_std::default_delete<spectest::ModuleCommand>_>
                       .super__Head_base<0UL,_spectest::ModuleCommand_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  command._M_t.
  super___uniq_ptr_impl<spectest::ModuleCommand,_std::default_delete<spectest::ModuleCommand>_>._M_t
  .super__Tuple_impl<0UL,_spectest::ModuleCommand_*,_std::default_delete<spectest::ModuleCommand>_>.
  super__Head_base<0UL,_spectest::ModuleCommand_*,_false>._M_head_impl._0_4_ =
       ExpectKey(this,"type");
  bVar1 = wabt::Failed(command._M_t.
                       super___uniq_ptr_impl<spectest::ModuleCommand,_std::default_delete<spectest::ModuleCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spectest::ModuleCommand_*,_std::default_delete<spectest::ModuleCommand>_>
                       .super__Head_base<0UL,_spectest::ModuleCommand_*,_false>._M_head_impl._0_4_);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  bVar1 = Match(this,"\"module\"");
  if (bVar1) {
    std::make_unique<spectest::ModuleCommand>();
    RVar2 = Expect(this,",");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
      pMVar3 = std::
               unique_ptr<spectest::ModuleCommand,_std::default_delete<spectest::ModuleCommand>_>::
               operator->(&local_30);
      RVar2 = ParseLine(this,&(pMVar3->super_CommandMixin<(wabt::CommandType)0>).super_Command.line)
      ;
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pMVar3 = std::
                   unique_ptr<spectest::ModuleCommand,_std::default_delete<spectest::ModuleCommand>_>
                   ::operator->(&local_30);
          command_1._M_t.
          super___uniq_ptr_impl<spectest::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_spectest::ActionCommandBase<(wabt::CommandType)2>_*,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
          .super__Head_base<0UL,_spectest::ActionCommandBase<(wabt::CommandType)2>_*,_false>.
          _M_head_impl._4_4_ = ParseOptNameStringValue(this,&pMVar3->name);
          bVar1 = wabt::Failed(command_1._M_t.
                               super___uniq_ptr_impl<spectest::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spectest::ActionCommandBase<(wabt::CommandType)2>_*,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
                               .
                               super__Head_base<0UL,_spectest::ActionCommandBase<(wabt::CommandType)2>_*,_false>
                               ._M_head_impl._4_4_);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            pMVar3 = std::
                     unique_ptr<spectest::ModuleCommand,_std::default_delete<spectest::ModuleCommand>_>
                     ::operator->(&local_30);
            command_1._M_t.
            super___uniq_ptr_impl<spectest::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_spectest::ActionCommandBase<(wabt::CommandType)2>_*,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
            .super__Head_base<0UL,_spectest::ActionCommandBase<(wabt::CommandType)2>_*,_false>.
            _M_head_impl._0_4_ = ParseFilename(this,&pMVar3->filename);
            bVar1 = wabt::Failed(command_1._M_t.
                                 super___uniq_ptr_impl<spectest::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spectest::ActionCommandBase<(wabt::CommandType)2>_*,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
                                 .
                                 super__Head_base<0UL,_spectest::ActionCommandBase<(wabt::CommandType)2>_*,_false>
                                 ._M_head_impl._0_4_);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::operator=
                        ((unique_ptr<spectest::Command,std::default_delete<spectest::Command>> *)
                         out_command,&local_30);
              bVar1 = false;
            }
          }
        }
      }
    }
    std::unique_ptr<spectest::ModuleCommand,_std::default_delete<spectest::ModuleCommand>_>::
    ~unique_ptr(&local_30);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
    goto LAB_0013b44d;
  }
  bVar1 = Match(this,"\"action\"");
  if (bVar1) {
    std::make_unique<spectest::ActionCommandBase<(wabt::CommandType)2>>();
    RVar2 = Expect(this,",");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
      pAVar4 = std::
               unique_ptr<spectest::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
               ::operator->(&local_50);
      RVar2 = ParseLine(this,&(pAVar4->super_CommandMixin<(wabt::CommandType)2>).super_Command.line)
      ;
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pAVar4 = std::
                   unique_ptr<spectest::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
                   ::operator->(&local_50);
          RVar2 = ParseAction(this,&pAVar4->action);
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            command_2._M_t.
            super___uniq_ptr_impl<spectest::RegisterCommand,_std::default_delete<spectest::RegisterCommand>_>
            ._M_t.
            super__Tuple_impl<0UL,_spectest::RegisterCommand_*,_std::default_delete<spectest::RegisterCommand>_>
            .super__Head_base<0UL,_spectest::RegisterCommand_*,_false>._M_head_impl._4_4_ =
                 Expect(this,",");
            bVar1 = wabt::Failed(command_2._M_t.
                                 super___uniq_ptr_impl<spectest::RegisterCommand,_std::default_delete<spectest::RegisterCommand>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spectest::RegisterCommand_*,_std::default_delete<spectest::RegisterCommand>_>
                                 .super__Head_base<0UL,_spectest::RegisterCommand_*,_false>.
                                 _M_head_impl._4_4_);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              command_2._M_t.
              super___uniq_ptr_impl<spectest::RegisterCommand,_std::default_delete<spectest::RegisterCommand>_>
              ._M_t.
              super__Tuple_impl<0UL,_spectest::RegisterCommand_*,_std::default_delete<spectest::RegisterCommand>_>
              .super__Head_base<0UL,_spectest::RegisterCommand_*,_false>._M_head_impl._0_4_ =
                   ParseActionResult(this);
              bVar1 = wabt::Failed(command_2._M_t.
                                   super___uniq_ptr_impl<spectest::RegisterCommand,_std::default_delete<spectest::RegisterCommand>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spectest::RegisterCommand_*,_std::default_delete<spectest::RegisterCommand>_>
                                   .super__Head_base<0UL,_spectest::RegisterCommand_*,_false>.
                                   _M_head_impl._0_4_);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
                std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::operator=
                          ((unique_ptr<spectest::Command,std::default_delete<spectest::Command>> *)
                           out_command,&local_50);
                bVar1 = false;
              }
            }
          }
        }
      }
    }
    std::
    unique_ptr<spectest::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<spectest::ActionCommandBase<(wabt::CommandType)2>_>_>
    ::~unique_ptr(&local_50);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
    goto LAB_0013b44d;
  }
  bVar1 = Match(this,"\"register\"");
  if (bVar1) {
    std::make_unique<spectest::RegisterCommand>();
    RVar2 = Expect(this,",");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
      pRVar5 = std::
               unique_ptr<spectest::RegisterCommand,_std::default_delete<spectest::RegisterCommand>_>
               ::operator->(&local_70);
      RVar2 = ParseLine(this,&(pRVar5->super_CommandMixin<(wabt::CommandType)3>).super_Command.line)
      ;
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pRVar5 = std::
                   unique_ptr<spectest::RegisterCommand,_std::default_delete<spectest::RegisterCommand>_>
                   ::operator->(&local_70);
          RVar2 = ParseOptNameStringValue(this,&pRVar5->name);
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            pRVar5 = std::
                     unique_ptr<spectest::RegisterCommand,_std::default_delete<spectest::RegisterCommand>_>
                     ::operator->(&local_70);
            command_3._M_t.
            super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)4>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
            .super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)4>_*,_false>.
            _M_head_impl._4_4_ = ParseKeyStringValue(this,"as",&pRVar5->as);
            bVar1 = wabt::Failed(command_3._M_t.
                                 super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)4>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
                                 .
                                 super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)4>_*,_false>
                                 ._M_head_impl._4_4_);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::operator=
                        ((unique_ptr<spectest::Command,std::default_delete<spectest::Command>> *)
                         out_command,&local_70);
              bVar1 = false;
            }
          }
        }
      }
    }
    std::unique_ptr<spectest::RegisterCommand,_std::default_delete<spectest::RegisterCommand>_>::
    ~unique_ptr(&local_70);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
    goto LAB_0013b44d;
  }
  bVar1 = Match(this,"\"assert_malformed\"");
  if (bVar1) {
    std::make_unique<spectest::AssertModuleCommand<(wabt::CommandType)4>>();
    RVar2 = Expect(this,",");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
      pAVar6 = std::
               unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
               ::operator->(&local_90);
      RVar2 = ParseLine(this,&(pAVar6->super_CommandMixin<(wabt::CommandType)4>).super_Command.line)
      ;
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pAVar6 = std::
                   unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
                   ::operator->(&local_90);
          RVar2 = ParseFilename(this,&pAVar6->filename);
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            RVar2 = Expect(this,",");
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              pAVar6 = std::
                       unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
                       ::operator->(&local_90);
              RVar2 = ParseKeyStringValue(this,"text",&pAVar6->text);
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
                command_4._M_t.
                super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)5>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                .super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)5>_*,_false>
                ._M_head_impl._4_4_ = Expect(this,",");
                bVar1 = wabt::Failed(command_4._M_t.
                                     super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)5>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                                     .
                                     super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)5>_*,_false>
                                     ._M_head_impl._4_4_);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                }
                else {
                  pAVar6 = std::
                           unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
                           ::operator->(&local_90);
                  command_4._M_t.
                  super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)5>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                  .
                  super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)5>_*,_false>
                  ._M_head_impl._0_4_ = ParseModuleType(this,&pAVar6->type);
                  bVar1 = wabt::Failed(command_4._M_t.
                                       super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)5>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                                       .
                                       super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)5>_*,_false>
                                       ._M_head_impl._0_4_);
                  if (bVar1) {
                    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                  }
                  else {
                    std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::
                    operator=((unique_ptr<spectest::Command,std::default_delete<spectest::Command>>
                               *)out_command,&local_90);
                    bVar1 = false;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::
    unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)4>_>_>
    ::~unique_ptr(&local_90);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
    goto LAB_0013b44d;
  }
  bVar1 = Match(this,"\"assert_invalid\"");
  if (bVar1) {
    std::make_unique<spectest::AssertModuleCommand<(wabt::CommandType)5>>();
    RVar2 = Expect(this,",");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
      pAVar7 = std::
               unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
               ::operator->(&local_b8);
      RVar2 = ParseLine(this,&(pAVar7->super_CommandMixin<(wabt::CommandType)5>).super_Command.line)
      ;
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pAVar7 = std::
                   unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                   ::operator->(&local_b8);
          RVar2 = ParseFilename(this,&pAVar7->filename);
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            RVar2 = Expect(this,",");
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              pAVar7 = std::
                       unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                       ::operator->(&local_b8);
              RVar2 = ParseKeyStringValue(this,"text",&pAVar7->text);
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
                command_5._M_t.
                super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)6>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                .super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)6>_*,_false>
                ._M_head_impl._4_4_ = Expect(this,",");
                bVar1 = wabt::Failed(command_5._M_t.
                                     super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)6>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                                     .
                                     super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)6>_*,_false>
                                     ._M_head_impl._4_4_);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                }
                else {
                  pAVar7 = std::
                           unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
                           ::operator->(&local_b8);
                  command_5._M_t.
                  super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)6>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                  .
                  super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)6>_*,_false>
                  ._M_head_impl._0_4_ = ParseModuleType(this,&pAVar7->type);
                  bVar1 = wabt::Failed(command_5._M_t.
                                       super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)6>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                                       .
                                       super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)6>_*,_false>
                                       ._M_head_impl._0_4_);
                  if (bVar1) {
                    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                  }
                  else {
                    std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::
                    operator=((unique_ptr<spectest::Command,std::default_delete<spectest::Command>>
                               *)out_command,&local_b8);
                    bVar1 = false;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::
    unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)5>_>_>
    ::~unique_ptr(&local_b8);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
    goto LAB_0013b44d;
  }
  bVar1 = Match(this,"\"assert_unlinkable\"");
  if (bVar1) {
    std::make_unique<spectest::AssertModuleCommand<(wabt::CommandType)6>>();
    RVar2 = Expect(this,",");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
      pAVar8 = std::
               unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
               ::operator->(&local_e0);
      RVar2 = ParseLine(this,&(pAVar8->super_CommandMixin<(wabt::CommandType)6>).super_Command.line)
      ;
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pAVar8 = std::
                   unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                   ::operator->(&local_e0);
          RVar2 = ParseFilename(this,&pAVar8->filename);
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            RVar2 = Expect(this,",");
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              pAVar8 = std::
                       unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                       ::operator->(&local_e0);
              RVar2 = ParseKeyStringValue(this,"text",&pAVar8->text);
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
                command_6._M_t.
                super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)7>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                .super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)7>_*,_false>
                ._M_head_impl._4_4_ = Expect(this,",");
                bVar1 = wabt::Failed(command_6._M_t.
                                     super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)7>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                                     .
                                     super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)7>_*,_false>
                                     ._M_head_impl._4_4_);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                }
                else {
                  pAVar8 = std::
                           unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
                           ::operator->(&local_e0);
                  command_6._M_t.
                  super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)7>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                  .
                  super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)7>_*,_false>
                  ._M_head_impl._0_4_ = ParseModuleType(this,&pAVar8->type);
                  bVar1 = wabt::Failed(command_6._M_t.
                                       super___uniq_ptr_impl<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)7>_*,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                                       .
                                       super__Head_base<0UL,_spectest::AssertModuleCommand<(wabt::CommandType)7>_*,_false>
                                       ._M_head_impl._0_4_);
                  if (bVar1) {
                    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                  }
                  else {
                    std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::
                    operator=((unique_ptr<spectest::Command,std::default_delete<spectest::Command>>
                               *)out_command,&local_e0);
                    bVar1 = false;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::
    unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)6>_>_>
    ::~unique_ptr(&local_e0);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
    goto LAB_0013b44d;
  }
  bVar1 = Match(this,"\"assert_uninstantiable\"");
  if (bVar1) {
    std::make_unique<spectest::AssertModuleCommand<(wabt::CommandType)7>>();
    RVar2 = Expect(this,",");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
      pAVar9 = std::
               unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
               ::operator->(&local_108);
      RVar2 = ParseLine(this,&(pAVar9->super_CommandMixin<(wabt::CommandType)7>).super_Command.line)
      ;
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pAVar9 = std::
                   unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                   ::operator->(&local_108);
          RVar2 = ParseFilename(this,&pAVar9->filename);
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            RVar2 = Expect(this,",");
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              pAVar9 = std::
                       unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                       ::operator->(&local_108);
              RVar2 = ParseKeyStringValue(this,"text",&pAVar9->text);
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
                command_7._M_t.
                super___uniq_ptr_impl<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>
                ._M_t.
                super__Tuple_impl<0UL,_spectest::AssertReturnCommand_*,_std::default_delete<spectest::AssertReturnCommand>_>
                .super__Head_base<0UL,_spectest::AssertReturnCommand_*,_false>._M_head_impl._4_4_ =
                     Expect(this,",");
                bVar1 = wabt::Failed(command_7._M_t.
                                     super___uniq_ptr_impl<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spectest::AssertReturnCommand_*,_std::default_delete<spectest::AssertReturnCommand>_>
                                     .super__Head_base<0UL,_spectest::AssertReturnCommand_*,_false>.
                                     _M_head_impl._4_4_);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                }
                else {
                  pAVar9 = std::
                           unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
                           ::operator->(&local_108);
                  command_7._M_t.
                  super___uniq_ptr_impl<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spectest::AssertReturnCommand_*,_std::default_delete<spectest::AssertReturnCommand>_>
                  .super__Head_base<0UL,_spectest::AssertReturnCommand_*,_false>._M_head_impl._0_4_
                       = ParseModuleType(this,&pAVar9->type);
                  bVar1 = wabt::Failed(command_7._M_t.
                                       super___uniq_ptr_impl<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spectest::AssertReturnCommand_*,_std::default_delete<spectest::AssertReturnCommand>_>
                                       .
                                       super__Head_base<0UL,_spectest::AssertReturnCommand_*,_false>
                                       ._M_head_impl._0_4_);
                  if (bVar1) {
                    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                  }
                  else {
                    std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::
                    operator=((unique_ptr<spectest::Command,std::default_delete<spectest::Command>>
                               *)out_command,&local_108);
                    bVar1 = false;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::
    unique_ptr<spectest::AssertModuleCommand<(wabt::CommandType)7>,_std::default_delete<spectest::AssertModuleCommand<(wabt::CommandType)7>_>_>
    ::~unique_ptr(&local_108);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
    goto LAB_0013b44d;
  }
  bVar1 = Match(this,"\"assert_return\"");
  if (!bVar1) {
    bVar1 = Match(this,"\"assert_trap\"");
    if (bVar1) {
      std::make_unique<spectest::AssertTrapCommandBase<(wabt::CommandType)9>>();
      RVar2 = Expect(this,",");
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        pAVar11 = std::
                  unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
                  ::operator->(&local_158);
        RVar2 = ParseLine(this,&(pAVar11->super_CommandMixin<(wabt::CommandType)9>).super_Command.
                                line);
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          RVar2 = Expect(this,",");
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            pAVar11 = std::
                      unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
                      ::operator->(&local_158);
            RVar2 = ParseAction(this,&pAVar11->action);
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              RVar2 = Expect(this,",");
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
                pAVar11 = std::
                          unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
                          ::operator->(&local_158);
                RVar2 = ParseKeyStringValue(this,"text",&pAVar11->text);
                bVar1 = wabt::Failed(RVar2);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                }
                else {
                  command_9._M_t.
                  super___uniq_ptr_impl<spectest::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)10>_*,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                  .
                  super__Head_base<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)10>_*,_false>
                  ._M_head_impl._4_4_ = Expect(this,",");
                  bVar1 = wabt::Failed(command_9._M_t.
                                       super___uniq_ptr_impl<spectest::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)10>_*,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                                       .
                                       super__Head_base<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)10>_*,_false>
                                       ._M_head_impl._4_4_);
                  if (bVar1) {
                    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                  }
                  else {
                    command_9._M_t.
                    super___uniq_ptr_impl<spectest::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)10>_*,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                    .
                    super__Head_base<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)10>_*,_false>
                    ._M_head_impl._0_4_ = ParseActionResult(this);
                    bVar1 = wabt::Failed(command_9._M_t.
                                         super___uniq_ptr_impl<spectest::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)10>_*,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                                         .
                                         super__Head_base<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)10>_*,_false>
                                         ._M_head_impl._0_4_);
                    if (bVar1) {
                      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                    }
                    else {
                      std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::
                      operator=((unique_ptr<spectest::Command,std::default_delete<spectest::Command>>
                                 *)out_command,&local_158);
                      bVar1 = false;
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::
      unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
      ::~unique_ptr(&local_158);
      if (bVar1) {
        return (Result)this_local._4_4_;
      }
    }
    else {
      bVar1 = Match(this,"\"assert_exhaustion\"");
      if (bVar1) {
        std::make_unique<spectest::AssertTrapCommandBase<(wabt::CommandType)10>>();
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pAVar12 = std::
                    unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                    ::operator->(&local_180);
          RVar2 = ParseLine(this,&(pAVar12->super_CommandMixin<(wabt::CommandType)10>).super_Command
                                  .line);
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            RVar2 = Expect(this,",");
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              pAVar12 = std::
                        unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                        ::operator->(&local_180);
              RVar2 = ParseAction(this,&pAVar12->action);
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
                RVar2 = Expect(this,",");
                bVar1 = wabt::Failed(RVar2);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                }
                else {
                  pAVar12 = std::
                            unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                            ::operator->(&local_180);
                  RVar2 = ParseKeyStringValue(this,"text",&pAVar12->text);
                  bVar1 = wabt::Failed(RVar2);
                  if (bVar1) {
                    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                  }
                  else {
                    command_10._M_t.
                    super___uniq_ptr_impl<spectest::AssertExceptionCommand,_std::default_delete<spectest::AssertExceptionCommand>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spectest::AssertExceptionCommand_*,_std::default_delete<spectest::AssertExceptionCommand>_>
                    .super__Head_base<0UL,_spectest::AssertExceptionCommand_*,_false>._M_head_impl.
                    _4_4_ = Expect(this,",");
                    bVar1 = wabt::Failed(command_10._M_t.
                                         super___uniq_ptr_impl<spectest::AssertExceptionCommand,_std::default_delete<spectest::AssertExceptionCommand>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_spectest::AssertExceptionCommand_*,_std::default_delete<spectest::AssertExceptionCommand>_>
                                         .
                                         super__Head_base<0UL,_spectest::AssertExceptionCommand_*,_false>
                                         ._M_head_impl._4_4_);
                    if (bVar1) {
                      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                    }
                    else {
                      command_10._M_t.
                      super___uniq_ptr_impl<spectest::AssertExceptionCommand,_std::default_delete<spectest::AssertExceptionCommand>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spectest::AssertExceptionCommand_*,_std::default_delete<spectest::AssertExceptionCommand>_>
                      .super__Head_base<0UL,_spectest::AssertExceptionCommand_*,_false>._M_head_impl
                      ._0_4_ = ParseActionResult(this);
                      bVar1 = wabt::Failed(command_10._M_t.
                                           super___uniq_ptr_impl<spectest::AssertExceptionCommand,_std::default_delete<spectest::AssertExceptionCommand>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_spectest::AssertExceptionCommand_*,_std::default_delete<spectest::AssertExceptionCommand>_>
                                           .
                                           super__Head_base<0UL,_spectest::AssertExceptionCommand_*,_false>
                                           ._M_head_impl._0_4_);
                      if (bVar1) {
                        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                        bVar1 = true;
                      }
                      else {
                        std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::
                        operator=((unique_ptr<spectest::Command,std::default_delete<spectest::Command>>
                                   *)out_command,&local_180);
                        bVar1 = false;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::
        unique_ptr<spectest::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
        ::~unique_ptr(&local_180);
        if (bVar1) {
          return (Result)this_local._4_4_;
        }
      }
      else {
        bVar1 = Match(this,"\"assert_exception\"");
        if (!bVar1) {
          PrintError(this,"unknown command type");
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        bVar1 = wabt::Features::exceptions_enabled(&s_features);
        if (!bVar1) {
          PrintError(this,"invalid command: exceptions not allowed");
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        std::make_unique<spectest::AssertExceptionCommand>();
        RVar2 = Expect(this,",");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pAVar13 = std::
                    unique_ptr<spectest::AssertExceptionCommand,_std::default_delete<spectest::AssertExceptionCommand>_>
                    ::operator->(&local_1a8);
          RVar2 = ParseLine(this,&(pAVar13->super_CommandMixin<(wabt::CommandType)11>).super_Command
                                  .line);
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            RVar2 = Expect(this,",");
            bVar1 = wabt::Failed(RVar2);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              pAVar13 = std::
                        unique_ptr<spectest::AssertExceptionCommand,_std::default_delete<spectest::AssertExceptionCommand>_>
                        ::operator->(&local_1a8);
              RVar2 = ParseAction(this,&pAVar13->action);
              bVar1 = wabt::Failed(RVar2);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
                RVar2 = Expect(this,",");
                bVar1 = wabt::Failed(RVar2);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                }
                else {
                  RVar2 = ParseActionResult(this);
                  bVar1 = wabt::Failed(RVar2);
                  if (bVar1) {
                    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                  }
                  else {
                    std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::
                    operator=((unique_ptr<spectest::Command,std::default_delete<spectest::Command>>
                               *)out_command,&local_1a8);
                    bVar1 = false;
                  }
                }
              }
            }
          }
        }
        std::
        unique_ptr<spectest::AssertExceptionCommand,_std::default_delete<spectest::AssertExceptionCommand>_>
        ::~unique_ptr(&local_1a8);
        if (bVar1) {
          return (Result)this_local._4_4_;
        }
      }
    }
    goto LAB_0013b44d;
  }
  std::make_unique<spectest::AssertReturnCommand>();
  RVar2 = Expect(this,",");
  bVar1 = wabt::Failed(RVar2);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    bVar1 = true;
  }
  else {
    pAVar10 = std::
              unique_ptr<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>
              ::operator->(&local_130);
    RVar2 = ParseLine(this,&(pAVar10->super_CommandMixin<(wabt::CommandType)8>).super_Command.line);
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
      RVar2 = Expect(this,",");
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        pAVar10 = std::
                  unique_ptr<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>
                  ::operator->(&local_130);
        RVar2 = ParseAction(this,&pAVar10->action);
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          RVar2 = Expect(this,",");
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            bVar1 = Match(this,"\"either\"");
            if (bVar1) {
              RVar2 = Expect(this,":");
              bVar1 = wabt::Failed(RVar2);
              if (!bVar1) {
                pAVar10 = std::
                          unique_ptr<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>
                          ::operator->(&local_130);
                pAVar10->expect_either = true;
                goto LAB_0013ab96;
              }
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              command_8._M_t.
              super___uniq_ptr_impl<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)9>_*,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
              .super__Head_base<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)9>_*,_false>
              ._M_head_impl._4_4_ = ExpectKey(this,"expected");
              bVar1 = wabt::Failed(command_8._M_t.
                                   super___uniq_ptr_impl<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)9>_*,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
                                   .
                                   super__Head_base<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)9>_*,_false>
                                   ._M_head_impl._4_4_);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
LAB_0013ab96:
                pAVar10 = std::
                          unique_ptr<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>
                          ::operator->(&local_130);
                command_8._M_t.
                super___uniq_ptr_impl<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)9>_*,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
                .
                super__Head_base<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)9>_*,_false>
                ._M_head_impl._0_4_ = ParseExpectedValues(this,&pAVar10->expected);
                bVar1 = wabt::Failed(command_8._M_t.
                                     super___uniq_ptr_impl<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)9>_*,_std::default_delete<spectest::AssertTrapCommandBase<(wabt::CommandType)9>_>_>
                                     .
                                     super__Head_base<0UL,_spectest::AssertTrapCommandBase<(wabt::CommandType)9>_*,_false>
                                     ._M_head_impl._0_4_);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                }
                else {
                  std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::
                  operator=((unique_ptr<spectest::Command,std::default_delete<spectest::Command>> *)
                            out_command,&local_130);
                  bVar1 = false;
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  unique_ptr<spectest::AssertReturnCommand,_std::default_delete<spectest::AssertReturnCommand>_>::
  ~unique_ptr(&local_130);
  if (bVar1) {
    return (Result)this_local._4_4_;
  }
LAB_0013b44d:
  RVar2 = Expect(this,"}");
  bVar1 = wabt::Failed(RVar2);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseCommand(CommandPtr* out_command) {
  EXPECT("{");
  EXPECT_KEY("type");
  if (Match("\"module\"")) {
    auto command = std::make_unique<ModuleCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseOptNameStringValue(&command->name));
    CHECK_RESULT(ParseFilename(&command->filename));
    *out_command = std::move(command);
  } else if (Match("\"action\"")) {
    auto command = std::make_unique<ActionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"register\"")) {
    auto command = std::make_unique<RegisterCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseOptNameStringValue(&command->name));
    PARSE_KEY_STRING_VALUE("as", &command->as);
    *out_command = std::move(command);
  } else if (Match("\"assert_malformed\"")) {
    auto command = std::make_unique<AssertMalformedCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_invalid\"")) {
    auto command = std::make_unique<AssertInvalidCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_unlinkable\"")) {
    auto command = std::make_unique<AssertUnlinkableCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_uninstantiable\"")) {
    auto command = std::make_unique<AssertUninstantiableCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_return\"")) {
    auto command = std::make_unique<AssertReturnCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    if (Match("\"either\"")) {
      EXPECT(":");
      command->expect_either = true;
    } else {
      EXPECT_KEY("expected");
    }
    CHECK_RESULT(ParseExpectedValues(&command->expected));
    *out_command = std::move(command);
  } else if (Match("\"assert_trap\"")) {
    auto command = std::make_unique<AssertTrapCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"assert_exhaustion\"")) {
    auto command = std::make_unique<AssertExhaustionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"assert_exception\"")) {
    if (!s_features.exceptions_enabled()) {
      PrintError("invalid command: exceptions not allowed");
      return wabt::Result::Error;
    }
    auto command = std::make_unique<AssertExceptionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else {
    PrintError("unknown command type");
    return wabt::Result::Error;
  }
  EXPECT("}");
  return wabt::Result::Ok;
}